

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O2

shared_ptr<Assimp::Blender::CustomDataLayer> __thiscall
Assimp::Blender::getCustomDataLayer
          (Blender *this,CustomData *customdata,CustomDataType cdtype,string *name)

{
  bool bVar1;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<Assimp::Blender::CustomDataLayer> sVar4;
  
  _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(in_register_00000014,cdtype);
  p_Var3 = &((customdata->layers).
             super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
             .
             super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>;
  do {
    if (p_Var3 == &((customdata->layers).
                    super_vector<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
                    .
                    super__Vector_base<std::shared_ptr<Assimp::Blender::CustomDataLayer>,_std::allocator<std::shared_ptr<Assimp::Blender::CustomDataLayer>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>)
    {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
LAB_0042659d:
      sVar4.super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var2._M_pi;
      sVar4.super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)this;
      return (shared_ptr<Assimp::Blender::CustomDataLayer>)
             sVar4.super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (p_Var3->_M_ptr->type == cdtype) {
      bVar1 = ::std::operator==(name,p_Var3->_M_ptr->name);
      _Var2._M_pi = extraout_RDX;
      if (bVar1) {
        ::std::__shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2> *)
                     this,p_Var3);
        _Var2._M_pi = extraout_RDX_00;
        goto LAB_0042659d;
      }
    }
    p_Var3 = p_Var3 + 1;
  } while( true );
}

Assistant:

std::shared_ptr<CustomDataLayer> getCustomDataLayer(const CustomData &customdata, const CustomDataType cdtype, const std::string &name) {
            for (auto it = customdata.layers.begin(); it != customdata.layers.end(); ++it) {
                if (it->get()->type == cdtype && name == it->get()->name) {
                    return *it;
                }
            }
            return nullptr;
        }